

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O3

void radio_dialog(t_radio *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *p_Var1;
  bool bVar2;
  int iVar3;
  t_symbol *s_00;
  int iVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_symbol *srl [3];
  t_atom undo [18];
  t_symbol *local_178 [4];
  t_atom local_158;
  undefined4 local_148;
  undefined4 local_140;
  undefined4 local_138;
  undefined4 local_130;
  undefined4 local_128;
  undefined4 local_120;
  undefined4 local_118;
  float local_110;
  undefined4 local_f8;
  float local_f0;
  
  tVar5 = atom_getfloatarg(0,argc,argv);
  tVar6 = atom_getfloatarg(4,argc,argv);
  tVar7 = atom_getfloatarg(6,argc,argv);
  iVar4 = (int)tVar7;
  iemgui_setdialogatoms(&x->x_gui,0x12,&local_158);
  local_148 = 1;
  local_140 = 0;
  local_138 = 1;
  local_130 = 0;
  local_128 = 1;
  local_120 = 0;
  local_118 = 1;
  if (x->x_compat == 0) {
    local_110 = -1.0;
  }
  else {
    local_110 = (float)x->x_change;
  }
  local_f8 = 1;
  local_f0 = (float)x->x_number;
  p_Var1 = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(p_Var1,(t_pd *)x,s_00,0x12,&local_158,argc,argv);
  x->x_change = (uint)((int)tVar6 != 0);
  iemgui_dialog(&x->x_gui,local_178,argc,argv);
  iVar3 = iemgui_clip_size((int)tVar5);
  p_Var1 = (x->x_gui).x_glist;
  iVar3 = iVar3 * p_Var1->gl_zoom;
  (x->x_gui).x_w = iVar3;
  (x->x_gui).x_h = iVar3;
  bVar2 = true;
  if ((x->x_number != iVar4) && (iVar3 = glist_isvisible(p_Var1), iVar3 != 0)) {
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,4);
    bVar2 = false;
  }
  x->x_number = iVar4;
  if (iVar4 <= x->x_on) {
    x->x_on = iVar4 + -1;
    x->x_on_old = iVar4 + -1;
  }
  if ((!bVar2) && (iVar4 = gobj_shouldvis((t_gobj *)x,(x->x_gui).x_glist), iVar4 != 0)) {
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,2);
    canvas_fixlinesfor((x->x_gui).x_glist,(t_text *)x);
    return;
  }
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void radio_dialog(t_radio *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = (int)atom_getfloatarg(0, argc, argv);
    int chg = (int)atom_getfloatarg(4, argc, argv);
    int num = (int)atom_getfloatarg(6, argc, argv);
    int sr_flags;
    int redraw = 0;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+1, 0);
    SETFLOAT(undo+2, 0);
    SETFLOAT(undo+3, 0);
    SETFLOAT(undo+4, (x->x_compat)?x->x_change:-1);
    SETFLOAT(undo+6, x->x_number);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    if(chg != 0) chg = 1;
    x->x_change = chg;
    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_w = iemgui_clip_size(a) * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    if (num != x->x_number && glist_isvisible(x->x_gui.x_glist))
    {
        /* we need to recreate the buttons */
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_ERASE);
        redraw = 1;
    }
    x->x_number = num;
    if(x->x_on >= x->x_number)
    {
        x->x_on_old = x->x_on = x->x_number - 1;
        x->x_on_old = x->x_on;
    }

    if (redraw && gobj_shouldvis((t_gobj *)x, x->x_gui.x_glist))
    {
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_NEW);
        canvas_fixlinesfor(x->x_gui.x_glist, (t_text*)x);
    } else {
        /* just reconfigure */
        iemgui_size((void *)x, &x->x_gui);
    }
}